

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O3

DomObjectHashConstIt<DomButtonGroup> __thiscall
Driver::findByAttributeNameIt<DomButtonGroup>
          (Driver *this,DomObjectHash<DomButtonGroup> *domHash,QString *name)

{
  undefined8 *puVar1;
  QArrayData *pQVar2;
  storage_type_conflict *psVar3;
  long lVar4;
  char cVar5;
  Data *pDVar6;
  ulong uVar7;
  ulong uVar8;
  Data *pDVar9;
  DomObjectHashConstIt<DomButtonGroup> DVar10;
  QStringView QVar11;
  QStringView QVar12;
  
  pDVar6 = domHash->d;
  if (pDVar6 == (Data *)0x0) {
    pDVar6 = (Data *)0x0;
    uVar7 = 0;
LAB_0014a88d:
    uVar8 = 0;
    pDVar9 = (Data *)0x0;
    if (uVar7 == 0 && pDVar6 == (Data *)0x0) goto LAB_0014a976;
  }
  else {
    if (pDVar6->spans->offsets[0] == 0xff) {
      uVar8 = 1;
      do {
        uVar7 = uVar8;
        if (pDVar6->numBuckets == uVar7) {
          pDVar6 = (Data *)0x0;
          uVar7 = 0;
          break;
        }
        uVar8 = uVar7 + 1;
      } while (pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
      goto LAB_0014a88d;
    }
    uVar7 = 0;
  }
  do {
    pDVar9 = pDVar6;
    uVar8 = uVar7;
    puVar1 = *(undefined8 **)
              pDVar9->spans[uVar8 >> 7].entries
              [pDVar9->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f]].storage.data;
    pQVar2 = (QArrayData *)*puVar1;
    psVar3 = (storage_type_conflict *)puVar1[1];
    lVar4 = puVar1[2];
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar4 == (name->d).size) {
      QVar11.m_data = (name->d).ptr;
      QVar11.m_size = lVar4;
      QVar12.m_data = psVar3;
      QVar12.m_size = lVar4;
      cVar5 = QtPrivate::equalStrings(QVar12,QVar11);
    }
    else {
      cVar5 = '\0';
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (cVar5 != '\0') goto LAB_0014a976;
    do {
      if (pDVar9->numBuckets - 1 == uVar8) {
        uVar8 = 0;
        pDVar9 = (Data *)0x0;
        break;
      }
      uVar8 = uVar8 + 1;
    } while (pDVar9->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
    uVar7 = uVar8;
    pDVar6 = pDVar9;
  } while ((uVar8 != 0) || (pDVar9 != (Data *)0x0));
  uVar8 = 0;
  pDVar9 = (Data *)0x0;
LAB_0014a976:
  DVar10.i.bucket = uVar8;
  DVar10.i.d = pDVar9;
  return (DomObjectHashConstIt<DomButtonGroup>)DVar10.i;
}

Assistant:

Driver::DomObjectHashConstIt<DomClass>
    Driver::findByAttributeNameIt(const DomObjectHash<DomClass> &domHash,
                                  const QString &name) const
{
    const auto end = domHash.cend();
    for (auto it = domHash.cbegin(); it != end; ++it) {
        if (it.key()->attributeName() == name)
            return it;
    }
    return end;
}